

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O0

void __thiscall jhu::thrax::PhraseTests_AllPairs_Test::TestBody(PhraseTests_AllPairs_Test *this)

{
  bool bVar1;
  char *message;
  char *in_RCX;
  string_view sv;
  AssertHelper local_90;
  Message local_88;
  size_type local_80;
  int local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  undefined1 local_50 [8];
  vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> ps;
  size_t local_30;
  undefined1 local_28 [8];
  Alignment a;
  PhraseTests_AllPairs_Test *this_local;
  
  a.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &ps.super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,"0-0 2-1 2-2 2-3");
  sv._M_str = in_RCX;
  sv._M_len = local_30;
  readAlignment((Alignment *)local_28,
                (thrax *)ps.
                         super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,sv);
  minimalConsistentPairs
            ((vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)local_50,
             (Alignment *)local_28,10);
  local_74 = 3;
  local_80 = std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::size
                       ((vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)
                        local_50);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_70,"3","ps.size()",&local_74,&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x72,message);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::~vector
            ((vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)local_50);
  std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::~vector
            ((vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_> *)local_28);
  return;
}

Assistant:

TEST(PhraseTests, AllPairs) {
  auto a = readAlignment("0-0 2-1 2-2 2-3");
  auto ps = minimalConsistentPairs(a, 10);
  ASSERT_EQ(3, ps.size());
}